

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall
ktx::FatalValidationError::FatalValidationError(FatalValidationError *this,ValidationReport *report)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  undefined1 uVar5;
  uint16_t uVar6;
  
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&report->details);
  *(undefined ***)this = &PTR__FatalValidationError_0025d9f8;
  uVar5 = report->field_0x1;
  uVar6 = report->id;
  (this->report).type = report->type;
  (this->report).field_0x1 = uVar5;
  (this->report).id = uVar6;
  paVar1 = &(this->report).message.field_2;
  (this->report).message._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (report->message)._M_dataplus._M_p;
  paVar2 = &(report->message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(report->message).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->report).message.field_2 + 8) = uVar4;
  }
  else {
    (this->report).message._M_dataplus._M_p = pcVar3;
    (this->report).message.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->report).message._M_string_length = (report->message)._M_string_length;
  (report->message)._M_dataplus._M_p = (pointer)paVar2;
  (report->message)._M_string_length = 0;
  (report->message).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->report).details.field_2;
  (this->report).details._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (report->details)._M_dataplus._M_p;
  paVar2 = &(report->details).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(report->details).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->report).details.field_2 + 8) = uVar4;
  }
  else {
    (this->report).details._M_dataplus._M_p = pcVar3;
    (this->report).details.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->report).details._M_string_length = (report->details)._M_string_length;
  (report->details)._M_dataplus._M_p = (pointer)paVar2;
  (report->details)._M_string_length = 0;
  (report->details).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit FatalValidationError(ValidationReport report) :
        std::runtime_error(report.details),
        report(std::move(report)) {}